

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockchain.cpp
# Opt level: O2

RPCHelpMan * loadtxoutset(void)

{
  string name;
  string m_key_name;
  string m_key_name_00;
  string m_key_name_01;
  string m_key_name_02;
  string m_key_name_03;
  RPCResult result;
  string description;
  string description_00;
  string description_01;
  string description_02;
  string description_03;
  string description_04;
  Fallback fallback;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_01;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_02;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_03;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  RPCResults results;
  RPCExamples examples;
  string description_05;
  RPCMethodImpl fun;
  RPCArgOptions opts;
  long lVar1;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  initializer_list<RPCArg> __l;
  initializer_list<RPCResult> __l_00;
  undefined8 in_stack_fffffffffffff818;
  undefined8 in_stack_fffffffffffff820;
  undefined8 in_stack_fffffffffffff828;
  undefined8 in_stack_fffffffffffff830;
  _Manager_type in_stack_fffffffffffff838;
  undefined8 in_stack_fffffffffffff840;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffff848;
  pointer in_stack_fffffffffffff858;
  pointer pRVar2;
  pointer in_stack_fffffffffffff860;
  pointer pRVar3;
  pointer in_stack_fffffffffffff868;
  pointer pRVar4;
  undefined8 in_stack_fffffffffffff870;
  pointer in_stack_fffffffffffff878;
  pointer pRVar5;
  pointer in_stack_fffffffffffff880;
  pointer pRVar6;
  pointer in_stack_fffffffffffff888;
  pointer pRVar7;
  undefined8 in_stack_fffffffffffff890;
  pointer in_stack_fffffffffffff898;
  pointer pRVar8;
  pointer in_stack_fffffffffffff8a0;
  pointer pRVar9;
  pointer in_stack_fffffffffffff8a8;
  pointer pRVar10;
  undefined8 in_stack_fffffffffffff8b0;
  pointer in_stack_fffffffffffff8b8;
  pointer pRVar11;
  pointer in_stack_fffffffffffff8c0;
  pointer pRVar12;
  pointer in_stack_fffffffffffff8c8;
  undefined1 in_stack_fffffffffffff8d0 [48];
  allocator_type local_6eb;
  allocator<char> local_6ea;
  allocator<char> local_6e9;
  vector<RPCArg,_std::allocator<RPCArg>_> local_6e8;
  allocator<char> local_6ca;
  allocator<char> local_6c9;
  string local_6c8;
  string local_6a8;
  string local_688;
  char *local_668;
  size_type local_660;
  char local_658 [8];
  undefined8 uStack_650;
  string local_648 [32];
  string local_628 [32];
  string local_608 [32];
  string local_5e8 [32];
  string local_5c8 [32];
  string local_5a8 [32];
  string local_588 [32];
  string local_568 [32];
  RPCResult local_548 [4];
  string local_328 [32];
  string local_308 [32];
  RPCResult local_2e8;
  RPCArgOptions local_260;
  string local_218 [32];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_1f8;
  undefined1 local_1a0;
  string local_198 [32];
  RPCArg local_178;
  string local_70 [32];
  string local_50 [32];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>(local_50,"loadtxoutset",&local_6c9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_70,
             "Load the serialized UTXO set from a file.\nOnce this snapshot is loaded, its contents will be deserialized into a second chainstate data structure, which is then used to sync to the network\'s tip. Meanwhile, the original chainstate will complete the initial block download process in the background, eventually validating up to the block that the snapshot is based upon.\n\nThe result is a usable bitcoind instance that is current with the network tip in a matter of minutes rather than hours. UTXO snapshot are typically obtained from third-party sources (HTTP, torrent, etc.) which is reasonable since their contents are always checked by hash.\n\nYou can find more information on this process in the `assumeutxo` design document (<https://github.com/bitcoin/bitcoin/blob/master/doc/design/assumeutxo.md>)."
             ,&local_6ca);
  std::__cxx11::string::string<std::allocator<char>>(local_198,"path",&local_6e9);
  local_1f8._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)NO;
  local_1a0 = 0;
  std::__cxx11::string::string<std::allocator<char>>
            (local_218,"path to the snapshot file. If relative, will be prefixed by datadir.",
             &local_6ea);
  local_260.oneline_description._M_dataplus._M_p = (pointer)&local_260.oneline_description.field_2;
  local_260.skip_type_check = false;
  local_260.oneline_description._M_string_length = 0;
  local_260.oneline_description.field_2._M_local_buf[0] = '\0';
  local_260.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_260.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_2_ = 0;
  local_260.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = 0;
  local_260.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
  local_260._58_8_ = 0;
  name._M_string_length = in_stack_fffffffffffff820;
  name._M_dataplus._M_p = (pointer)in_stack_fffffffffffff818;
  name.field_2._M_allocated_capacity = in_stack_fffffffffffff828;
  name.field_2._8_8_ = in_stack_fffffffffffff830;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_fffffffffffff840;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_fffffffffffff838;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_16_ = (undefined1  [16])in_stack_fffffffffffff848;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_fffffffffffff858;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_fffffffffffff860;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_fffffffffffff868;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_fffffffffffff870;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_fffffffffffff878;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_fffffffffffff880;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_fffffffffffff888;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_fffffffffffff890;
  description_05._M_string_length = (size_type)in_stack_fffffffffffff8a0;
  description_05._M_dataplus._M_p = (pointer)in_stack_fffffffffffff898;
  description_05.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffff8a8;
  description_05.field_2._8_8_ = in_stack_fffffffffffff8b0;
  opts.oneline_description._M_dataplus._M_p = (pointer)in_stack_fffffffffffff8c0;
  opts._0_8_ = in_stack_fffffffffffff8b8;
  opts.oneline_description._M_string_length = (size_type)in_stack_fffffffffffff8c8;
  opts.oneline_description.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_fffffffffffff8d0._0_16_;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data =
       (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )in_stack_fffffffffffff8d0._16_24_;
  opts.hidden = (bool)in_stack_fffffffffffff8d0[0x28];
  opts.also_positional = (bool)in_stack_fffffffffffff8d0[0x29];
  opts._66_6_ = in_stack_fffffffffffff8d0._42_6_;
  RPCArg::RPCArg(&local_178,name,(Type)local_198,fallback,description_05,opts);
  __l._M_len = 1;
  __l._M_array = &local_178;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector(&local_6e8,__l,&local_6eb);
  std::__cxx11::string::string<std::allocator<char>>
            (local_308,"",(allocator<char> *)&stack0xfffffffffffff8f7);
  std::__cxx11::string::string<std::allocator<char>>
            (local_328,"",(allocator<char> *)&stack0xfffffffffffff8f6);
  std::__cxx11::string::string<std::allocator<char>>
            (local_568,"coins_loaded",(allocator<char> *)&stack0xfffffffffffff8d7);
  std::__cxx11::string::string<std::allocator<char>>
            (local_588,"the number of coins loaded from the snapshot",
             (allocator<char> *)&stack0xfffffffffffff8d6);
  pRVar11 = (pointer)0x0;
  pRVar12 = (pointer)0x0;
  m_key_name._M_string_length = in_stack_fffffffffffff820;
  m_key_name._M_dataplus._M_p = (pointer)in_stack_fffffffffffff818;
  m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffff828;
  m_key_name.field_2._8_8_ = in_stack_fffffffffffff830;
  description._M_string_length = in_stack_fffffffffffff840;
  description._M_dataplus._M_p = (pointer)in_stack_fffffffffffff838;
  description.field_2 = in_stack_fffffffffffff848;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = in_stack_fffffffffffff860;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = in_stack_fffffffffffff858;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_fffffffffffff868;
  RPCResult::RPCResult(local_548,NUM,m_key_name,description,inner,SUB81(local_568,0));
  std::__cxx11::string::string<std::allocator<char>>
            (local_5a8,"tip_hash",(allocator<char> *)&stack0xfffffffffffff8b7);
  std::__cxx11::string::string<std::allocator<char>>
            (local_5c8,"the hash of the base of the snapshot",
             (allocator<char> *)&stack0xfffffffffffff8b6);
  pRVar8 = (pointer)0x0;
  pRVar9 = (pointer)0x0;
  pRVar10 = (pointer)0x0;
  m_key_name_00._M_string_length = in_stack_fffffffffffff820;
  m_key_name_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff818;
  m_key_name_00.field_2._M_allocated_capacity = in_stack_fffffffffffff828;
  m_key_name_00.field_2._8_8_ = in_stack_fffffffffffff830;
  description_00._M_string_length = in_stack_fffffffffffff840;
  description_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff838;
  description_00.field_2 = in_stack_fffffffffffff848;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff860;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff858;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff868;
  RPCResult::RPCResult
            (local_548 + 1,STR_HEX,m_key_name_00,description_00,inner_00,SUB81(local_5a8,0));
  std::__cxx11::string::string<std::allocator<char>>
            (local_5e8,"base_height",(allocator<char> *)&stack0xfffffffffffff897);
  std::__cxx11::string::string<std::allocator<char>>
            (local_608,"the height of the base of the snapshot",
             (allocator<char> *)&stack0xfffffffffffff896);
  pRVar5 = (pointer)0x0;
  pRVar6 = (pointer)0x0;
  pRVar7 = (pointer)0x0;
  m_key_name_01._M_string_length = in_stack_fffffffffffff820;
  m_key_name_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffff818;
  m_key_name_01.field_2._M_allocated_capacity = in_stack_fffffffffffff828;
  m_key_name_01.field_2._8_8_ = in_stack_fffffffffffff830;
  description_01._M_string_length = in_stack_fffffffffffff840;
  description_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffff838;
  description_01.field_2 = in_stack_fffffffffffff848;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff860;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff858;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff868;
  RPCResult::RPCResult(local_548 + 2,NUM,m_key_name_01,description_01,inner_01,SUB81(local_5e8,0));
  std::__cxx11::string::string<std::allocator<char>>
            (local_628,"path",(allocator<char> *)&stack0xfffffffffffff877);
  std::__cxx11::string::string<std::allocator<char>>
            (local_648,"the absolute path that the snapshot was loaded from",
             (allocator<char> *)&stack0xfffffffffffff876);
  pRVar2 = (pointer)0x0;
  pRVar3 = (pointer)0x0;
  pRVar4 = (pointer)0x0;
  m_key_name_02._M_string_length = in_stack_fffffffffffff820;
  m_key_name_02._M_dataplus._M_p = (pointer)in_stack_fffffffffffff818;
  m_key_name_02.field_2._M_allocated_capacity = in_stack_fffffffffffff828;
  m_key_name_02.field_2._8_8_ = in_stack_fffffffffffff830;
  description_02._M_string_length = in_stack_fffffffffffff840;
  description_02._M_dataplus._M_p = (pointer)in_stack_fffffffffffff838;
  description_02.field_2._M_local_buf = in_stack_fffffffffffff848._M_local_buf;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  RPCResult::RPCResult(local_548 + 3,STR,m_key_name_02,description_02,inner_02,SUB81(local_628,0));
  __l_00._M_len = 4;
  __l_00._M_array = local_548;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff8d8,__l_00,
             (allocator_type *)&stack0xfffffffffffff857);
  m_key_name_03._M_string_length = in_stack_fffffffffffff820;
  m_key_name_03._M_dataplus._M_p = (pointer)in_stack_fffffffffffff818;
  m_key_name_03.field_2._M_allocated_capacity = in_stack_fffffffffffff828;
  m_key_name_03.field_2._8_8_ = in_stack_fffffffffffff830;
  description_03._M_string_length = in_stack_fffffffffffff840;
  description_03._M_dataplus._M_p = (pointer)in_stack_fffffffffffff838;
  description_03.field_2 = in_stack_fffffffffffff848;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar3;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar2;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar4;
  RPCResult::RPCResult(&local_2e8,OBJ,m_key_name_03,description_03,inner_03,SUB81(local_308,0));
  result.m_key_name._M_dataplus._M_p = (pointer)in_stack_fffffffffffff820;
  result._0_8_ = in_stack_fffffffffffff818;
  result.m_key_name._M_string_length = in_stack_fffffffffffff828;
  result.m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffff830;
  result.m_key_name.field_2._8_8_ = in_stack_fffffffffffff838;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff840;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._8_16_ = in_stack_fffffffffffff848;
  result._64_8_ = pRVar2;
  result.m_description._M_dataplus._M_p = (pointer)pRVar3;
  result.m_description._M_string_length = (size_type)pRVar4;
  result.m_description.field_2._M_allocated_capacity = in_stack_fffffffffffff870;
  result.m_description.field_2._8_8_ = pRVar5;
  result.m_cond._M_dataplus._M_p = (pointer)pRVar6;
  result.m_cond._M_string_length = (size_type)pRVar7;
  result.m_cond.field_2._M_allocated_capacity = in_stack_fffffffffffff890;
  result.m_cond.field_2._8_8_ = pRVar8;
  RPCResults::RPCResults((RPCResults *)&stack0xfffffffffffff8f8,result);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6a8,"loadtxoutset -rpcclienttimeout=0",
             (allocator<char> *)&stack0xfffffffffffff856);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6c8,"utxo.dat",(allocator<char> *)&stack0xfffffffffffff855);
  HelpExampleCli(&local_688,&local_6a8,&local_6c8);
  local_668 = local_658;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_688._M_dataplus._M_p == &local_688.field_2) {
    uStack_650 = local_688.field_2._8_8_;
  }
  else {
    local_668 = local_688._M_dataplus._M_p;
  }
  local_660 = local_688._M_string_length;
  local_688._M_string_length = 0;
  local_688.field_2._M_local_buf[0] = '\0';
  description_04._M_string_length =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/blockchain.cpp:3019:9)>
       ::_M_invoke;
  description_04._M_dataplus._M_p =
       (pointer)std::
                _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/blockchain.cpp:3019:9)>
                ::_M_manager;
  description_04.field_2 = in_stack_fffffffffffff848;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)pRVar3;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)pRVar2;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pRVar4;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = pRVar5;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff870;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pRVar6;
  examples.m_examples._M_string_length = in_stack_fffffffffffff890;
  examples.m_examples._M_dataplus._M_p = (pointer)pRVar7;
  examples.m_examples.field_2._M_allocated_capacity = (size_type)pRVar8;
  examples.m_examples.field_2._8_8_ = pRVar9;
  fun.super__Function_base._M_functor._8_8_ = in_stack_fffffffffffff8b0;
  fun.super__Function_base._M_functor._M_unused._M_object = pRVar10;
  fun.super__Function_base._M_manager = (_Manager_type)pRVar11;
  fun._M_invoker = (_Invoker_type)pRVar12;
  local_688._M_dataplus._M_p = (pointer)&local_688.field_2;
  RPCHelpMan::RPCHelpMan
            (in_RDI,(string)ZEXT1632(CONCAT88(in_stack_fffffffffffff820,&stack0xfffffffffffff828)),
             description_04,args,results,examples,fun);
  std::_Function_base::~_Function_base((_Function_base *)&stack0xfffffffffffff828);
  std::__cxx11::string::~string((string *)&local_668);
  std::__cxx11::string::~string((string *)&local_688);
  std::__cxx11::string::~string((string *)&local_6c8);
  std::__cxx11::string::~string((string *)&local_6a8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff8f8);
  RPCResult::~RPCResult(&local_2e8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff8d8);
  lVar1 = 0x198;
  do {
    RPCResult::~RPCResult((RPCResult *)((long)&local_548[0].m_type + lVar1));
    lVar1 = lVar1 + -0x88;
  } while (lVar1 != -0x88);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff858);
  std::__cxx11::string::~string(local_648);
  std::__cxx11::string::~string(local_628);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff878);
  std::__cxx11::string::~string(local_608);
  std::__cxx11::string::~string(local_5e8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff898);
  std::__cxx11::string::~string(local_5c8);
  std::__cxx11::string::~string(local_5a8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff8b8);
  std::__cxx11::string::~string(local_588);
  std::__cxx11::string::~string(local_568);
  std::__cxx11::string::~string(local_328);
  std::__cxx11::string::~string(local_308);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_6e8);
  RPCArg::~RPCArg(&local_178);
  RPCArgOptions::~RPCArgOptions(&local_260);
  std::__cxx11::string::~string(local_218);
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_1f8._M_first);
  std::__cxx11::string::~string(local_198);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan loadtxoutset()
{
    return RPCHelpMan{
        "loadtxoutset",
        "Load the serialized UTXO set from a file.\n"
        "Once this snapshot is loaded, its contents will be "
        "deserialized into a second chainstate data structure, which is then used to sync to "
        "the network's tip. "
        "Meanwhile, the original chainstate will complete the initial block download process in "
        "the background, eventually validating up to the block that the snapshot is based upon.\n\n"

        "The result is a usable bitcoind instance that is current with the network tip in a "
        "matter of minutes rather than hours. UTXO snapshot are typically obtained from "
        "third-party sources (HTTP, torrent, etc.) which is reasonable since their "
        "contents are always checked by hash.\n\n"

        "You can find more information on this process in the `assumeutxo` design "
        "document (<https://github.com/bitcoin/bitcoin/blob/master/doc/design/assumeutxo.md>).",
        {
            {"path",
                RPCArg::Type::STR,
                RPCArg::Optional::NO,
                "path to the snapshot file. If relative, will be prefixed by datadir."},
        },
        RPCResult{
            RPCResult::Type::OBJ, "", "",
                {
                    {RPCResult::Type::NUM, "coins_loaded", "the number of coins loaded from the snapshot"},
                    {RPCResult::Type::STR_HEX, "tip_hash", "the hash of the base of the snapshot"},
                    {RPCResult::Type::NUM, "base_height", "the height of the base of the snapshot"},
                    {RPCResult::Type::STR, "path", "the absolute path that the snapshot was loaded from"},
                }
        },
        RPCExamples{
            HelpExampleCli("loadtxoutset -rpcclienttimeout=0", "utxo.dat")
        },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    NodeContext& node = EnsureAnyNodeContext(request.context);
    ChainstateManager& chainman = EnsureChainman(node);
    const fs::path path{AbsPathForConfigVal(EnsureArgsman(node), fs::u8path(self.Arg<std::string>("path")))};

    FILE* file{fsbridge::fopen(path, "rb")};
    AutoFile afile{file};
    if (afile.IsNull()) {
        throw JSONRPCError(
            RPC_INVALID_PARAMETER,
            "Couldn't open file " + path.utf8string() + " for reading.");
    }

    SnapshotMetadata metadata{chainman.GetParams().MessageStart()};
    try {
        afile >> metadata;
    } catch (const std::ios_base::failure& e) {
        throw JSONRPCError(RPC_DESERIALIZATION_ERROR, strprintf("Unable to parse metadata: %s", e.what()));
    }

    auto activation_result{chainman.ActivateSnapshot(afile, metadata, false)};
    if (!activation_result) {
        throw JSONRPCError(RPC_INTERNAL_ERROR, strprintf("Unable to load UTXO snapshot: %s. (%s)", util::ErrorString(activation_result).original, path.utf8string()));
    }

    CBlockIndex& snapshot_index{*CHECK_NONFATAL(*activation_result)};

    UniValue result(UniValue::VOBJ);
    result.pushKV("coins_loaded", metadata.m_coins_count);
    result.pushKV("tip_hash", snapshot_index.GetBlockHash().ToString());
    result.pushKV("base_height", snapshot_index.nHeight);
    result.pushKV("path", fs::PathToString(path));
    return result;
},
    };
}